

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Delaunay_psm.cpp
# Opt level: O0

void __thiscall
GEO::AdaptiveKdTree::plane_split
          (AdaptiveKdTree *this,index_t b_in,index_t e_in,coord_index_t coord,double val,
          index_t *br1_out,index_t *br2_out)

{
  bool bVar1;
  int iVar2;
  uint *puVar3;
  uint *puVar4;
  double dVar5;
  int br2;
  int br1;
  int r;
  int l;
  int e;
  int b;
  index_t *br2_out_local;
  index_t *br1_out_local;
  double val_local;
  coord_index_t coord_local;
  index_t e_in_local;
  index_t b_in_local;
  AdaptiveKdTree *this_local;
  
  br2 = e_in - 1;
  br1 = b_in;
  while( true ) {
    while( true ) {
      iVar2 = br1;
      bVar1 = false;
      if (br1 < (int)e_in) {
        dVar5 = point_coord(this,br1,coord);
        bVar1 = dVar5 < val;
      }
      if (!bVar1) break;
      br1 = br1 + 1;
    }
    while( true ) {
      bVar1 = false;
      if (-1 < br2) {
        dVar5 = point_coord(this,br2,coord);
        bVar1 = val <= dVar5;
      }
      if (!bVar1) break;
      br2 = br2 + -1;
    }
    if (br2 < br1) break;
    puVar3 = vector<unsigned_int>::operator[](&(this->super_KdTree).point_index_,br1);
    puVar4 = vector<unsigned_int>::operator[](&(this->super_KdTree).point_index_,br2);
    std::swap<unsigned_int>(puVar3,puVar4);
    br1 = br1 + 1;
    br2 = br2 + -1;
  }
  br2 = e_in - 1;
  while( true ) {
    while( true ) {
      bVar1 = false;
      if (br1 < (int)e_in) {
        dVar5 = point_coord(this,br1,coord);
        bVar1 = dVar5 <= val;
      }
      if (!bVar1) break;
      br1 = br1 + 1;
    }
    while( true ) {
      bVar1 = false;
      if (iVar2 <= br2) {
        dVar5 = point_coord(this,br2,coord);
        bVar1 = val < dVar5;
      }
      if (!bVar1) break;
      br2 = br2 + -1;
    }
    if (br2 < br1) break;
    puVar3 = vector<unsigned_int>::operator[](&(this->super_KdTree).point_index_,br1);
    puVar4 = vector<unsigned_int>::operator[](&(this->super_KdTree).point_index_,br2);
    std::swap<unsigned_int>(puVar3,puVar4);
    br1 = br1 + 1;
    br2 = br2 + -1;
  }
  *br1_out = iVar2;
  *br2_out = br1;
  return;
}

Assistant:

void AdaptiveKdTree::plane_split(
	index_t b_in, index_t e_in, coord_index_t coord, double val,
	index_t& br1_out, index_t& br2_out
    ) {
	int b = int(b_in);
	int e = int(e_in);
	int l=b;
	int r=e-1;
	while(true) {
	    while(l < e && point_coord(l,coord) < val) {
		++l;
	    }
	    while(r >= 0 && point_coord(r,coord) >= val) {
		--r;
	    }
	    if(l > r) {
		break;
	    }
	    std::swap(point_index_[l], point_index_[r]);
	    ++l; --r;
	}
	int br1 = l;
	r = e-1;
	while(true) {
	    while(l < e && point_coord(l,coord) <= val) {
		++l;
	    }
	    while(r >= br1 && point_coord(r,coord) > val) {
		--r;
	    }
	    if(l > r) {
		break;
	    }
	    std::swap(point_index_[l], point_index_[r]);
	    ++l; --r;
	}
	int br2 = l;
	br1_out = index_t(br1);
	br2_out = index_t(br2);
    }